

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_align.c
# Opt level: O2

int32 align_start_utt(char *uttid)

{
  snode_t *psVar1;
  pnode_t *ppVar2;
  snode_t **ppsVar3;
  long lVar4;
  
  ppsVar3 = cur_active;
  curfrm = 0;
  shead.score = 0;
  shead.hist = (history_t *)0x0;
  hist_head = (history_t *)0x0;
  n_active = 0;
  psVar1 = &shead;
  lVar4 = 0;
  while( true ) {
    psVar1 = (snode_t *)psVar1->succlist;
    if (psVar1 == (snode_t *)0x0) {
      n_active = (int)lVar4 + 1;
      ppsVar3[(int)lVar4] = (snode_t *)0x0;
      return 0;
    }
    ppVar2 = psVar1->pnode;
    if (-1 < *(int *)&ppVar2->alloc_next) break;
    *(int32 *)&ppVar2->alloc_next = 0;
    n_active = (int32)(lVar4 + 1);
    ppsVar3[lVar4] = (snode_t *)ppVar2;
    lVar4 = lVar4 + 1;
  }
  __assert_fail("l->node->active_frm < 0",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/s3_align.c"
                ,0x40d,"int32 align_start_utt(char *)");
}

Assistant:

int32
align_start_utt(char *uttid)
{
    slink_t *l;

    curfrm = 0;
    shead.score = 0;
    shead.hist = NULL;
    hist_head = NULL;

    n_active = 0;
    for (l = shead.succlist; l; l = l->next) {
        assert(l->node->active_frm < 0);
        l->node->active_frm = 0;
        cur_active[n_active++] = l->node;
    }
    cur_active[n_active++] = NULL;

    return 0;
}